

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CallErrorHandler(SQVM *this,SQObjectPtr *error)

{
  SQObjectPtr *in_RDI;
  SQObjectPtr out;
  SQObjectPtr *in_stack_00000038;
  SQInteger in_stack_00000040;
  SQInteger in_stack_00000048;
  SQObjectPtr *in_stack_00000050;
  SQVM *in_stack_00000058;
  SQVM *in_stack_ffffffffffffffd0;
  SQInteger in_stack_ffffffffffffffd8;
  SQVM *in_stack_ffffffffffffffe0;
  
  if (in_RDI[8].super_SQObject._type != OT_NULL) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffe0);
    Push(in_stack_ffffffffffffffd0,in_RDI);
    Push(in_stack_ffffffffffffffd0,in_RDI);
    Call(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
         (SQBool)this);
    Pop(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void SQVM::CallErrorHandler(SQObjectPtr &error)
{
    if(sq_type(_errorhandler) != OT_NULL) {
        SQObjectPtr out;
        Push(_roottable); Push(error);
        Call(_errorhandler, 2, _top-2, out,SQFalse);
        Pop(2);
    }
}